

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

void __thiscall
icu_63::FixedDecimal::adjustForMinFractionDigits(FixedDecimal *this,int32_t minFractionDigits)

{
  long lVar1;
  int32_t i;
  int iVar2;
  
  if (this->visibleDecimalDigitCount < minFractionDigits) {
    lVar1 = this->decimalDigits;
    iVar2 = 0;
    while ((iVar2 < minFractionDigits - this->visibleDecimalDigitCount &&
           (lVar1 < 100000000000000000))) {
      lVar1 = lVar1 * 10;
      this->decimalDigits = lVar1;
      iVar2 = iVar2 + 1;
    }
    this->visibleDecimalDigitCount = minFractionDigits;
  }
  return;
}

Assistant:

void FixedDecimal::adjustForMinFractionDigits(int32_t minFractionDigits) {
    int32_t numTrailingFractionZeros = minFractionDigits - visibleDecimalDigitCount;
    if (numTrailingFractionZeros > 0) {
        for (int32_t i=0; i<numTrailingFractionZeros; i++) {
            // Do not let the decimalDigits value overflow if there are many trailing zeros.
            // Limit the value to 18 digits, the most that a 64 bit int can fully represent.
            if (decimalDigits >= 100000000000000000LL) {
                break;
            }
            decimalDigits *= 10;
        }
        visibleDecimalDigitCount += numTrailingFractionZeros;
    }
}